

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_stats
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int iVar6;
  ulong size;
  int iVar7;
  uint uVar8;
  int iVar9;
  parasail_result_t *ppVar10;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  int *ptr_04;
  int *ptr_05;
  int *ptr_06;
  int *ptr_07;
  int *ptr_08;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  ulong size_00;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int NWL;
  int NWS;
  int NWM;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_cc;
  int local_c8;
  ulong uVar11;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_stats_cold_8();
    return (parasail_result_t *)0x0;
  }
  if (s2Len < 1) {
    parasail_sg_flags_stats_cold_7();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sg_flags_stats_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sg_flags_stats_cold_5();
    return (parasail_result_t *)0x0;
  }
  uVar11 = (ulong)(uint)_s1Len;
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_stats_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_stats_cold_3();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_stats_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_sg_flags_stats_cold_1();
      return (parasail_result_t *)0x0;
    }
    if (matrix->type == 0) goto LAB_00550a87;
  }
  uVar11 = (ulong)(uint)matrix->length;
LAB_00550a87:
  ppVar10 = parasail_result_new_stats();
  if (ppVar10 != (parasail_result_t *)0x0) {
    ppVar10->flag =
         (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
         (uint)(s2_end != 0) << 0xf | ppVar10->flag | 0x1410102;
    iVar29 = (int)uVar11;
    ptr = parasail_memalign_int(0x10,(long)iVar29);
    size = (ulong)(uint)s2Len;
    ptr_00 = parasail_memalign_int(0x10,size);
    size_00 = (ulong)(s2Len + 1);
    ptr_01 = parasail_memalign_int(0x10,size_00);
    ptr_02 = parasail_memalign_int(0x10,size_00);
    ptr_03 = parasail_memalign_int(0x10,size_00);
    ptr_04 = parasail_memalign_int(0x10,size_00);
    ptr_05 = parasail_memalign_int(0x10,size_00);
    ptr_06 = parasail_memalign_int(0x10,size_00);
    ptr_07 = parasail_memalign_int(0x10,size_00);
    ptr_08 = parasail_memalign_int(0x10,size_00);
    auVar32._0_4_ = -(uint)((int)ptr == 0);
    auVar32._4_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0);
    auVar32._8_4_ = -(uint)((int)ptr_00 == 0);
    auVar32._12_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0);
    auVar37._4_4_ = auVar32._0_4_;
    auVar37._0_4_ = auVar32._4_4_;
    auVar37._8_4_ = auVar32._12_4_;
    auVar37._12_4_ = auVar32._8_4_;
    auVar33._0_4_ = -(uint)((int)ptr_01 == 0);
    auVar33._4_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0);
    auVar33._8_4_ = -(uint)((int)ptr_02 == 0);
    auVar33._12_4_ = -(uint)((int)((ulong)ptr_02 >> 0x20) == 0);
    auVar38._4_4_ = auVar33._0_4_;
    auVar38._0_4_ = auVar33._4_4_;
    auVar38._8_4_ = auVar33._12_4_;
    auVar38._12_4_ = auVar33._8_4_;
    auVar38 = packssdw(auVar37 & auVar32,auVar38 & auVar33);
    auVar35._0_4_ = -(uint)((int)ptr_03 == 0);
    auVar35._4_4_ = -(uint)((int)((ulong)ptr_03 >> 0x20) == 0);
    auVar35._8_4_ = -(uint)((int)ptr_04 == 0);
    auVar35._12_4_ = -(uint)((int)((ulong)ptr_04 >> 0x20) == 0);
    auVar31._4_4_ = auVar35._0_4_;
    auVar31._0_4_ = auVar35._4_4_;
    auVar31._8_4_ = auVar35._12_4_;
    auVar31._12_4_ = auVar35._8_4_;
    auVar36._0_4_ = -(uint)((int)ptr_05 == 0);
    auVar36._4_4_ = -(uint)((int)((ulong)ptr_05 >> 0x20) == 0);
    auVar36._8_4_ = -(uint)((int)ptr_06 == 0);
    auVar36._12_4_ = -(uint)((int)((ulong)ptr_06 >> 0x20) == 0);
    auVar34._4_4_ = auVar36._0_4_;
    auVar34._0_4_ = auVar36._4_4_;
    auVar34._8_4_ = auVar36._12_4_;
    auVar34._12_4_ = auVar36._8_4_;
    auVar32 = packssdw(auVar31 & auVar35,auVar34 & auVar36);
    auVar32 = packssdw(auVar38,auVar32);
    if ((ptr_08 != (int *)0x0 && ptr_07 != (int *)0x0) &&
        ((((((((auVar32 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              (auVar32 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar32 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar32 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar32 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar32 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar32 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar32[0xf]))
    {
      if (0 < iVar29) {
        piVar5 = matrix->mapper;
        uVar17 = 0;
        do {
          ptr[uVar17] = piVar5[(byte)_s1[uVar17]];
          uVar17 = uVar17 + 1;
        } while (uVar11 != uVar17);
      }
      iVar7 = iVar29 + -1;
      uVar8 = s2Len - 1;
      uVar11 = (ulong)uVar8;
      piVar5 = matrix->mapper;
      uVar17 = 0;
      do {
        ptr_00[uVar17] = piVar5[(byte)_s2[uVar17]];
        uVar17 = uVar17 + 1;
      } while (size != uVar17);
      *ptr_01 = 0;
      *ptr_02 = 0;
      *ptr_03 = 0;
      *ptr_04 = 0;
      *ptr_05 = -0x40000000;
      *ptr_06 = 0;
      *ptr_07 = 0;
      *ptr_08 = 0;
      if (s2_beg == 0) {
        iVar12 = -open;
        lVar18 = 0;
        do {
          ptr_01[lVar18 + 1] = iVar12;
          ptr_02[lVar18 + 1] = 0;
          ptr_03[lVar18 + 1] = 0;
          ptr_04[lVar18 + 1] = 0;
          ptr_05[lVar18 + 1] = -0x40000000;
          ptr_06[lVar18 + 1] = 0;
          ptr_07[lVar18 + 1] = 0;
          ptr_08[lVar18 + 1] = 0;
          iVar12 = iVar12 - gap;
          lVar18 = lVar18 + 1;
        } while (size_00 - 1 != lVar18);
      }
      else {
        lVar18 = 0;
        do {
          ptr_01[lVar18 + 1] = 0;
          ptr_02[lVar18 + 1] = 0;
          ptr_03[lVar18 + 1] = 0;
          ptr_04[lVar18 + 1] = 0;
          ptr_05[lVar18 + 1] = -0x40000000;
          ptr_06[lVar18 + 1] = 0;
          ptr_07[lVar18 + 1] = 0;
          ptr_08[lVar18 + 1] = 0;
          lVar18 = lVar18 + 1;
        } while (size_00 - 1 != lVar18);
      }
      local_110 = iVar7;
      if (iVar29 < 1) {
        iVar12 = -0x40000000;
        local_104 = -0x40000000;
        local_10c = -0x40000000;
        local_108 = -0x40000000;
      }
      else {
        piVar5 = matrix->matrix;
        local_108 = -0x40000000;
        uVar17 = 1;
        local_10c = -0x40000000;
        local_104 = -0x40000000;
        iVar12 = -0x40000000;
        do {
          if (matrix->type == 0) {
            lVar18 = (long)ptr[uVar17 - 1];
          }
          else {
            lVar18 = uVar17 - 1;
          }
          lVar18 = lVar18 * matrix->size;
          lVar21 = 0;
          iVar23 = *ptr_01;
          iVar25 = *ptr_02;
          iVar19 = *ptr_03;
          iVar6 = (1 - (int)uVar17) * gap - open;
          if (s1_beg != 0) {
            iVar6 = 0;
          }
          iVar20 = *ptr_04;
          *ptr_01 = iVar6;
          *ptr_02 = 0;
          *ptr_03 = 0;
          *ptr_04 = 0;
          iVar22 = -0x40000000;
          local_c8 = 0;
          local_cc = 0;
          iVar24 = 0;
          iVar9 = 0;
          iVar15 = 0;
          iVar28 = 0;
          do {
            iVar1 = ptr_01[lVar21 + 1];
            iVar2 = ptr_02[lVar21 + 1];
            iVar3 = ptr_03[lVar21 + 1];
            iVar26 = iVar1 - open;
            iVar16 = ptr_05[lVar21 + 1] - gap;
            iVar27 = iVar16;
            if (iVar16 < iVar26) {
              iVar27 = iVar26;
            }
            iVar4 = ptr_04[lVar21 + 1];
            ptr_05[lVar21 + 1] = iVar27;
            iVar13 = iVar6 - open;
            iVar30 = iVar22 - gap;
            iVar22 = iVar13;
            if (iVar13 <= iVar30) {
              iVar22 = iVar30;
            }
            iVar23 = iVar23 + piVar5[lVar18 + ptr_00[lVar21]];
            iVar6 = iVar22;
            if (iVar22 < iVar23) {
              iVar6 = iVar23;
            }
            if (iVar6 <= iVar27) {
              iVar6 = iVar27;
            }
            if (iVar16 < iVar26) {
              ptr_06[lVar21 + 1] = iVar2;
              ptr_07[lVar21 + 1] = iVar3;
              iVar27 = iVar4;
            }
            else {
              iVar27 = ptr_08[lVar21 + 1];
            }
            ptr_08[lVar21 + 1] = iVar27 + 1;
            iVar16 = iVar15;
            if (iVar13 <= iVar30) {
              iVar16 = local_cc;
              iVar28 = iVar24;
              iVar9 = local_c8;
            }
            iVar24 = iVar28;
            local_c8 = iVar9 + 1;
            if (iVar6 == iVar23) {
              iVar9 = iVar20 + 1;
              iVar15 = iVar19 + (uint)(0 < piVar5[lVar18 + ptr_00[lVar21]]);
              iVar28 = iVar25 + (uint)(ptr[uVar17 - 1] == ptr_00[lVar21]);
            }
            else {
              iVar9 = local_c8;
              iVar15 = iVar16;
              iVar28 = iVar24;
              if (iVar6 == ptr_05[lVar21 + 1]) {
                iVar28 = ptr_06[lVar21 + 1];
                iVar15 = ptr_07[lVar21 + 1];
                iVar9 = iVar27 + 1;
              }
            }
            ptr_01[lVar21 + 1] = iVar6;
            ptr_02[lVar21 + 1] = iVar28;
            ptr_03[lVar21 + 1] = iVar15;
            ptr_04[lVar21 + 1] = iVar9;
            lVar21 = lVar21 + 1;
            iVar23 = iVar1;
            iVar25 = iVar2;
            iVar19 = iVar3;
            iVar20 = iVar4;
            local_cc = iVar16;
          } while (size_00 - 1 != lVar21);
          if ((s1_end != 0) && (iVar12 < iVar6)) {
            local_110 = (int)uVar17 + -1;
            iVar12 = iVar6;
            local_10c = iVar15;
            local_108 = iVar9;
            local_104 = iVar28;
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != iVar29 + 1);
      }
      if (s1_end == 0 || s2_end == 0) {
        uVar14 = uVar8;
        if (s2_end != 0) {
          uVar17 = 0;
          do {
            if (iVar12 < ptr_01[uVar17 + 1]) {
              local_104 = ptr_02[uVar17 + 1];
              local_10c = ptr_03[uVar17 + 1];
              local_108 = ptr_04[uVar17 + 1];
              uVar11 = uVar17 & 0xffffffff;
              iVar12 = ptr_01[uVar17 + 1];
              local_110 = iVar7;
            }
            uVar14 = (uint)uVar11;
            uVar17 = uVar17 + 1;
          } while (size_00 - 1 != uVar17);
        }
      }
      else {
        uVar17 = 1;
        do {
          iVar29 = ptr_01[uVar17];
          if (iVar12 < iVar29) {
            local_104 = ptr_02[uVar17];
            local_10c = ptr_03[uVar17];
            local_108 = ptr_04[uVar17];
            iVar12 = iVar29;
LAB_005511d6:
            uVar11 = (ulong)((int)uVar17 - 1);
            local_110 = iVar7;
          }
          else if ((iVar29 == iVar12) && ((long)uVar17 <= (long)(int)uVar11)) {
            local_104 = ptr_02[uVar17];
            local_10c = ptr_03[uVar17];
            local_108 = ptr_04[uVar17];
            goto LAB_005511d6;
          }
          uVar14 = (uint)uVar11;
          uVar17 = uVar17 + 1;
        } while (size_00 != uVar17);
      }
      if (s2_end == 0 && s1_end == 0) {
        iVar12 = ptr_01[size];
        local_104 = ptr_02[size];
        local_10c = ptr_03[size];
        local_108 = ptr_04[size];
        local_110 = iVar7;
        uVar14 = uVar8;
      }
      ppVar10->score = iVar12;
      ppVar10->end_query = local_110;
      ppVar10->end_ref = uVar14;
      ((ppVar10->field_4).stats)->matches = local_104;
      ((ppVar10->field_4).stats)->similar = local_10c;
      ((ppVar10->field_4).stats)->length = local_108;
      parasail_free(ptr_08);
      parasail_free(ptr_07);
      parasail_free(ptr_06);
      parasail_free(ptr_05);
      parasail_free(ptr_04);
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      return ppVar10;
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict H = NULL;
    int * restrict HM = NULL;
    int * restrict HS = NULL;
    int * restrict HL = NULL;
    int * restrict F = NULL;
    int * restrict FM = NULL;
    int * restrict FS = NULL;
    int * restrict FL = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;
    int score = 0;
    int matches = 0;
    int similar = 0;
    int length = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    i = 0;
    j = 0;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    score = NEG_INF_32;
    matches = NEG_INF_32;
    similar = NEG_INF_32;
    length = NEG_INF_32;
    end_query = s1Len-1;
    end_ref = s2Len-1;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_NOVEC
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1 = parasail_memalign_int(16, s1Len);
    s2 = parasail_memalign_int(16, s2Len);
    H = parasail_memalign_int(16, s2Len+1);
    HM = parasail_memalign_int(16, s2Len+1);
    HS = parasail_memalign_int(16, s2Len+1);
    HL = parasail_memalign_int(16, s2Len+1);
    F = parasail_memalign_int(16, s2Len+1);
    FM = parasail_memalign_int(16, s2Len+1);
    FS = parasail_memalign_int(16, s2Len+1);
    FL = parasail_memalign_int(16, s2Len+1);

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2) return NULL;
    if (!H) return NULL;
    if (!HM) return NULL;
    if (!HS) return NULL;
    if (!HL) return NULL;
    if (!F) return NULL;
    if (!FM) return NULL;
    if (!FS) return NULL;
    if (!FL) return NULL;

    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* upper left corner */
    H[0] = 0;
    HM[0] = 0;
    HS[0] = 0;
    HL[0] = 0;
    F[0] = NEG_INF_32;
    FM[0] = 0;
    FS[0] = 0;
    FL[0] = 0;
    
    /* first row */
    if (s2_beg) {
        for (j=1; j<=s2Len; ++j) {
            H[j] = 0;
            HM[j] = 0;
            HS[j] = 0;
            HL[j] = 0;
            F[j] = NEG_INF_32;
            FM[j] = 0;
            FS[j] = 0;
            FL[j] = 0;
        }
    }
    else {
        for (j=1; j<=s2Len; ++j) {
            H[j] = -open -(j-1)*gap;
            HM[j] = 0;
            HS[j] = 0;
            HL[j] = 0;
            F[j] = NEG_INF_32;
            FM[j] = 0;
            FS[j] = 0;
            FL[j] = 0;
        }
    }


    /* iter over first sequence */
    for (i=1; i<=s1Len; ++i) {
        const int * const restrict matrow =
            matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
            &matrix->matrix[matrix->size*s1[i-1]] :
            &matrix->matrix[matrix->size*(i-1)];
        /* init first column */
        int NH = H[0];
        int NHM = HM[0];
        int NHS = HS[0];
        int NHL = HL[0];
        int WH = s1_beg ? 0 : (-open - (i-1)*gap);
        int WHM = 0;
        int WHS = 0;
        int WHL = 0;
        int E = NEG_INF_32;
        int EM = 0;
        int ES = 0;
        int EL = 0;
        H[0] = WH;
        HM[0] = WHM;
        HS[0] = WHS;
        HL[0] = WHL;
        for (j=1; j<=s2Len; ++j) {
            int H_dag;
            int E_opn;
            int E_ext;
            int F_opn;
            int F_ext;
            int NWH = NH;
            int NWM = NHM;
            int NWS = NHS;
            int NWL = NHL;
            NH = H[j];
            NHM = HM[j];
            NHS = HS[j];
            NHL = HL[j];
            F_opn = NH - open;
            F_ext = F[j] - gap;
            F[j] = MAX(F_opn, F_ext);
            E_opn = WH - open;
            E_ext = E - gap;
            E = MAX(E_opn, E_ext);
            H_dag = NWH + matrow[s2[j-1]];
            WH = MAX(H_dag, E);
            WH = MAX(WH, F[j]);
            if (F_opn > F_ext) {
                FM[j] = NHM;
                FS[j] = NHS;
                FL[j] = NHL;
            }
            FL[j] += 1;
            if (E_opn > E_ext) {
                EM = WHM;
                ES = WHS;
                EL = WHL;
            }
            EL += 1;
            if (WH == H_dag) {
                WHM  = NWM + (s1[i-1] == s2[j-1]);
                WHS  = NWS + (matrow[s2[j-1]] > 0);
                WHL  = NWL + 1;
            }
            else if (WH == F[j]) {
                WHM  = FM[j];
                WHS  = FS[j];
                WHL  = FL[j];
            }
            else {
                WHM  = EM;
                WHS  = ES;
                WHL  = EL;
            }
            H[j] = WH;
            HM[j] = WHM;
            HS[j] = WHS;
            HL[j] = WHL;
#ifdef PARASAIL_TABLE
            result->stats->tables->score_table[1LL*(i-1)*s2Len + (j-1)] = WH;
            result->stats->tables->matches_table[1LL*(i-1)*s2Len + (j-1)] = WHM;
            result->stats->tables->similar_table[1LL*(i-1)*s2Len + (j-1)] = WHS;
            result->stats->tables->length_table[1LL*(i-1)*s2Len + (j-1)] = WHL;
#endif
        }
        if (s1_end && WH > score) {
            score = WH;
            matches = WHM;
            similar = WHS;
            length = WHL;
            end_query = i-1;
            end_ref = s2Len-1;
        }
#ifdef PARASAIL_ROWCOL
        result->stats->rowcols->score_col[i-1] = WH;
        result->stats->rowcols->matches_col[i-1] = WHM;
        result->stats->rowcols->similar_col[i-1] = WHS;
        result->stats->rowcols->length_col[i-1] = WHL;
#endif
    }
    if (s1_end && s2_end) {
        for (j=1; j<=s2Len; ++j) {
            i = s1Len;
            if (H[j] > score) {
                score = H[j];
                matches = HM[j];
                similar = HS[j];
                length = HL[j];
                end_query = i-1;
                end_ref = j-1;
            }
            else if (score == H[j] && j-1 < end_ref) {
                matches = HM[j];
                similar = HS[j];
                length = HL[j];
                end_query = i-1;
                end_ref = j-1;
            }
        }
    }
    else if (s2_end) {
        for (j=1; j<=s2Len; ++j) {
            i = s1Len;
            if (H[j] > score) {
                score = H[j];
                matches = HM[j];
                similar = HS[j];
                length = HL[j];
                end_query = i-1;
                end_ref = j-1;
            }
        }
    }
    if (!s1_end && !s2_end) {
        score = H[s2Len];
        matches = HM[s2Len];
        similar = HS[s2Len];
        length = HL[s2Len];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }
#ifdef PARASAIL_ROWCOL
    for (j=1; j<=s2Len; ++j) {
        result->stats->rowcols->score_row[j-1] = H[j];
        result->stats->rowcols->matches_row[j-1] = HM[j];
        result->stats->rowcols->similar_row[j-1] = HS[j];
        result->stats->rowcols->length_row[j-1] = HL[j];
    }
#endif

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(FL);
    parasail_free(FS);
    parasail_free(FM);
    parasail_free(F);
    parasail_free(HL);
    parasail_free(HS);
    parasail_free(HM);
    parasail_free(H);
    parasail_free(s2);
    parasail_free(s1);

    return result;
}